

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecMan.c
# Opt level: O3

void Cec_ManSimStop(Cec_ManSim_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  
  pVVar1 = p->vClassOld;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vClassNew;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vClassTemp;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vRefinedC;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar3 = p->vCiSimInfo;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
  }
  pVVar3 = p->vCoSimInfo;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
  }
  if (p->pScores != (int *)0x0) {
    free(p->pScores);
    p->pScores = (int *)0x0;
  }
  if (p->pCexComb != (Abc_Cex_t *)0x0) {
    free(p->pCexComb);
    p->pCexComb = (Abc_Cex_t *)0x0;
  }
  if (p->pCexes != (void **)0x0) {
    free(p->pCexes);
    p->pCexes = (void **)0x0;
  }
  if (p->pMems != (uint *)0x0) {
    free(p->pMems);
    p->pMems = (uint *)0x0;
  }
  if (p->pSimInfo != (int *)0x0) {
    free(p->pSimInfo);
  }
  free(p);
  return;
}

Assistant:

void Cec_ManSimStop( Cec_ManSim_t * p )  
{
    Vec_IntFree( p->vClassOld );
    Vec_IntFree( p->vClassNew );
    Vec_IntFree( p->vClassTemp );
    Vec_IntFree( p->vRefinedC );
    if ( p->vCiSimInfo ) 
        Vec_PtrFree( p->vCiSimInfo );
    if ( p->vCoSimInfo ) 
        Vec_PtrFree( p->vCoSimInfo );
    ABC_FREE( p->pScores );
    ABC_FREE( p->pCexComb );
    ABC_FREE( p->pCexes );
    ABC_FREE( p->pMems );
    ABC_FREE( p->pSimInfo );
    ABC_FREE( p );
}